

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alp.cpp
# Opt level: O3

bool duckdb::AlpCompressionFun::TypeIsSupported(PhysicalType physical_type)

{
  return (byte)(physical_type - FLOAT) < 2;
}

Assistant:

bool AlpCompressionFun::TypeIsSupported(const PhysicalType physical_type) {
	switch (physical_type) {
	case PhysicalType::FLOAT:
	case PhysicalType::DOUBLE:
		return true;
	default:
		return false;
	}
}